

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool wildcard_match(char *wildcard,char *target)

{
  char firstbyte;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  
  if ((*wildcard == '*') && (wildcard[1] == '\0')) {
    return true;
  }
  cVar4 = *target;
  do {
    while( true ) {
      if (cVar4 == '\0') {
        do {
          cVar4 = *wildcard;
          wildcard = wildcard + 1;
        } while (cVar4 == '*');
        return cVar4 == '\0';
      }
      firstbyte = *wildcard;
      if (firstbyte == '\0') {
        return false;
      }
      sVar2 = GetUTF8Length(firstbyte);
      sVar3 = GetUTF8Length(cVar4);
      if (firstbyte != '?') break;
LAB_00140858:
      cVar4 = target[sVar3];
      wildcard = wildcard + sVar2;
      target = target + sVar3;
    }
    if (firstbyte != '*') {
      if (firstbyte != cVar4) {
        return false;
      }
      goto LAB_00140858;
    }
    if (wildcard[sVar2] == '\0') {
      return true;
    }
    _Var1 = wildcard_match_rec(wildcard,target + sVar3);
    wildcard = wildcard + sVar2;
    if (_Var1) {
      return true;
    }
  } while( true );
}

Assistant:

bool wildcard_match(const char *wildcard, const char *target)
{
#if (defined(_WIN32) && !defined(__CYGWIN__))
	if (strcmp(wildcard, "*.*") == 0)
	{
		return true;
	}
#endif
	if (strcmp(wildcard, "*") == 0)
	{
		return true;
	}
	else
	{
		return wildcard_match_rec(wildcard, target);
	}
}